

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfFunctionBlocker::IsFunctionBlocked
          (cmIfFunctionBlocker *this,cmListFileFunction *lff,cmMakefile *mf,
          cmExecutionStatus *inStatus)

{
  uint *puVar1;
  long lVar2;
  cmMakefile *pcVar3;
  MessageType MVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pcVar8;
  cmake *pcVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  cmExecutionStatus status;
  string errorString;
  MessageType messType;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmListFileBacktrace bt;
  cmConditionEvaluator conditionEvaluator;
  cmExecutionStatus local_fc;
  cmMakefile *local_f8;
  string local_f0;
  cmExecutionStatus *local_d0;
  MessageType local_c4;
  Internals *local_c0;
  string local_b8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_98;
  undefined1 local_78 [72];
  
  iVar5 = cmsys::SystemTools::Strucmp((lff->super_cmListFileContext).Name._M_dataplus._M_p,"if");
  if (iVar5 == 0) {
    this->ScopeDepth = this->ScopeDepth + 1;
  }
  else {
    iVar5 = cmsys::SystemTools::Strucmp
                      ((lff->super_cmListFileContext).Name._M_dataplus._M_p,"endif");
    if (iVar5 == 0) {
      puVar1 = &this->ScopeDepth;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 == 0) {
        local_d0 = inStatus;
        cmMakefile::RemoveFunctionBlocker
                  ((cmMakefile *)local_78,(cmFunctionBlocker *)mf,(cmListFileFunction *)this);
        bVar13 = (Internals *)local_78._0_8_ != (Internals *)0x0;
        if (bVar13) {
          local_c0 = (Internals *)local_78._0_8_;
          local_fc.ReturnInvoked = false;
          local_fc.BreakInvoked = false;
          local_fc.ContinueInvoked = false;
          local_fc.NestedError = false;
          pcVar8 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_f8 = mf;
          if ((this->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_finish != pcVar8) {
            iVar5 = 0;
            uVar10 = 0;
            uVar11 = 1;
            do {
              iVar6 = cmsys::SystemTools::Strucmp
                                (pcVar8[uVar10].super_cmListFileContext.Name._M_dataplus._M_p,"if");
              iVar7 = cmsys::SystemTools::Strucmp
                                ((this->Functions).
                                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                 super_cmListFileContext.Name._M_dataplus._M_p,"endif");
              iVar5 = (iVar5 + (uint)(iVar6 == 0)) - (uint)(iVar7 == 0);
              if (iVar5 == 0) {
                iVar6 = cmsys::SystemTools::Strucmp
                                  ((this->Functions).
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                   super_cmListFileContext.Name._M_dataplus._M_p,"else");
                if (iVar6 == 0) {
                  bVar12 = this->HasRun;
                  this->IsBlocking = bVar12;
                  this->HasRun = true;
                  if ((bVar12 == false) &&
                     (pcVar9 = cmMakefile::GetCMakeInstance(local_f8), pcVar9->Trace == true)) {
                    cmMakefile::PrintCommandTrace
                              (local_f8,(this->Functions).
                                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar10);
                  }
                }
                else {
                  iVar6 = cmsys::SystemTools::Strucmp
                                    ((this->Functions).
                                     super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                     super_cmListFileContext.Name._M_dataplus._M_p,"elseif");
                  if (iVar6 != 0) goto LAB_0031df71;
                  if (this->HasRun == true) {
                    this->IsBlocking = true;
                  }
                  else {
                    pcVar9 = cmMakefile::GetCMakeInstance(local_f8);
                    if (pcVar9->Trace == true) {
                      cmMakefile::PrintCommandTrace
                                (local_f8,(this->Functions).
                                          super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                          ._M_impl.super__Vector_impl_data._M_start + uVar10);
                    }
                    pcVar3 = local_f8;
                    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                    local_f0._M_string_length = 0;
                    local_f0.field_2._M_local_buf[0] = '\0';
                    local_98.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    local_98.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
                    local_98.
                    super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
                    cmMakefile::ExpandArguments
                              (local_f8,&(this->Functions).
                                         super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                         ._M_impl.super__Vector_impl_data._M_start[uVar10].Arguments
                               ,&local_98,(char *)0x0);
                    cmConditionEvaluator::cmConditionEvaluator
                              ((cmConditionEvaluator *)(local_78 + 0x30),pcVar3);
                    bVar12 = cmConditionEvaluator::IsTrue
                                       ((cmConditionEvaluator *)(local_78 + 0x30),&local_98,
                                        &local_f0,&local_c4);
                    if (local_f0._M_string_length != 0) {
                      cmIfCommandError_abi_cxx11_(&local_b8,&local_98);
                      std::__cxx11::string::_M_append
                                ((char *)&local_b8,(ulong)local_f0._M_dataplus._M_p);
                      pcVar3 = local_f8;
                      cmMakefile::GetBacktrace
                                ((cmListFileBacktrace *)local_78,local_f8,
                                 &(this->Functions).
                                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar10].
                                  super_cmListFileContext);
                      pcVar9 = cmMakefile::GetCMakeInstance(pcVar3);
                      MVar4 = local_c4;
                      cmake::IssueMessage(pcVar9,local_c4,&local_b8,(cmListFileBacktrace *)local_78)
                      ;
                      if (MVar4 == FATAL_ERROR) {
                        cmSystemTools::s_FatalErrorOccured = true;
                        std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                                  ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                                   local_78);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                          operator_delete(local_b8._M_dataplus._M_p,
                                          local_b8.field_2._M_allocated_capacity + 1);
                        }
                        std::
                        vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        ::~vector(&local_98);
                        local_78._0_8_ = local_c0;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                          operator_delete(local_f0._M_dataplus._M_p,
                                          CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                                   local_f0.field_2._M_local_buf[0]) + 1);
                          local_78._0_8_ = local_c0;
                        }
                        break;
                      }
                      std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector
                                ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)
                                 local_78);
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                        operator_delete(local_b8._M_dataplus._M_p,
                                        local_b8.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (bVar12) {
                      this->IsBlocking = false;
                      this->HasRun = true;
                    }
                    std::
                    vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                    ~vector(&local_98);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                      operator_delete(local_f0._M_dataplus._M_p,
                                      CONCAT71(local_f0.field_2._M_allocated_capacity._1_7_,
                                               local_f0.field_2._M_local_buf[0]) + 1);
                    }
                  }
                }
              }
              else {
LAB_0031df71:
                if (this->IsBlocking == false) {
                  local_fc.ReturnInvoked = false;
                  local_fc.BreakInvoked = false;
                  local_fc.ContinueInvoked = false;
                  local_fc.NestedError = false;
                  cmMakefile::ExecuteCommand
                            (local_f8,(this->Functions).
                                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar10,&local_fc);
                  local_78._0_8_ = local_c0;
                  if (local_fc.ReturnInvoked == true) {
                    local_d0->ReturnInvoked = true;
                    break;
                  }
                  if (local_fc.BreakInvoked == true) {
                    local_d0->BreakInvoked = true;
                    break;
                  }
                  if (local_fc.ContinueInvoked == true) {
                    local_d0->ContinueInvoked = true;
                    break;
                  }
                }
              }
              pcVar8 = (this->Functions).
                       super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              uVar10 = ((long)(this->Functions).
                              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar8 >> 5) *
                       -0x5555555555555555;
              bVar12 = uVar11 <= uVar10;
              lVar2 = uVar10 - uVar11;
              uVar10 = uVar11;
              local_78._0_8_ = local_c0;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar12 && lVar2 != 0);
          }
        }
        if ((Internals *)local_78._0_8_ == (Internals *)0x0) {
          return bVar13;
        }
        (*(code *)*(_List_node_base **)
                   ((long)((((Internals *)local_78._0_8_)->VarStack).
                           super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                           _M_node.super__List_node_base._M_next + 1) + 8))();
        return bVar13;
      }
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::push_back
            (&this->Functions,lff);
  return true;
}

Assistant:

bool cmIfFunctionBlocker::
IsFunctionBlocked(const cmListFileFunction& lff,
                  cmMakefile &mf,
                  cmExecutionStatus &inStatus)
{
  // we start by recording all the functions
  if (!cmSystemTools::Strucmp(lff.Name.c_str(),"if"))
    {
    this->ScopeDepth++;
    }
  else if (!cmSystemTools::Strucmp(lff.Name.c_str(),"endif"))
    {
    this->ScopeDepth--;
    // if this is the endif for this if statement, then start executing
    if (!this->ScopeDepth)
      {
      // Remove the function blocker for this scope or bail.
      cmsys::auto_ptr<cmFunctionBlocker>
        fb(mf.RemoveFunctionBlocker(this, lff));
      if(!fb.get()) { return false; }

      // execute the functions for the true parts of the if statement
      cmExecutionStatus status;
      int scopeDepth = 0;
      for(unsigned int c = 0; c < this->Functions.size(); ++c)
        {
        // keep track of scope depth
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"if"))
          {
          scopeDepth++;
          }
        if (!cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"endif"))
          {
          scopeDepth--;
          }
        // watch for our state change
        if (scopeDepth == 0 &&
            !cmSystemTools::Strucmp(this->Functions[c].Name.c_str(),"else"))
          {
          this->IsBlocking = this->HasRun;
          this->HasRun = true;

          // if trace is enabled, print a (trivially) evaluated "else"
          // statement
          if(!this->IsBlocking && mf.GetCMakeInstance()->GetTrace())
            {
            mf.PrintCommandTrace(this->Functions[c]);
            }
          }
        else if (scopeDepth == 0 && !cmSystemTools::Strucmp
                 (this->Functions[c].Name.c_str(),"elseif"))
          {
          if (this->HasRun)
            {
            this->IsBlocking = true;
            }
          else
            {
            // if trace is enabled, print the evaluated "elseif" statement
            if(mf.GetCMakeInstance()->GetTrace())
              {
              mf.PrintCommandTrace(this->Functions[c]);
              }

            std::string errorString;

            std::vector<cmExpandedCommandArgument> expandedArguments;
            mf.ExpandArguments(this->Functions[c].Arguments,
                               expandedArguments);

            cmake::MessageType messType;

            cmConditionEvaluator conditionEvaluator(mf);

            bool isTrue = conditionEvaluator.IsTrue(
              expandedArguments, errorString, messType);

            if (!errorString.empty())
              {
              std::string err = cmIfCommandError(expandedArguments);
              err += errorString;
              cmListFileBacktrace bt = mf.GetBacktrace(this->Functions[c]);
              mf.GetCMakeInstance()->IssueMessage(messType, err, bt);
              if (messType == cmake::FATAL_ERROR)
                {
                cmSystemTools::SetFatalErrorOccured();
                return true;
                }
              }

            if (isTrue)
              {
              this->IsBlocking = false;
              this->HasRun = true;
              }
            }
          }

        // should we execute?
        else if (!this->IsBlocking)
          {
          status.Clear();
          mf.ExecuteCommand(this->Functions[c],status);
          if (status.GetReturnInvoked())
            {
            inStatus.SetReturnInvoked(true);
            return true;
            }
          if (status.GetBreakInvoked())
            {
            inStatus.SetBreakInvoked(true);
            return true;
            }
          if (status.GetContinueInvoked())
            {
            inStatus.SetContinueInvoked(true);
            return true;
            }
          }
        }
      return true;
      }
    }

  // record the command
  this->Functions.push_back(lff);

  // always return true
  return true;
}